

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saxe-init.cc
# Opt level: O1

void cnn::OrthonormalRandom(uint dd,float g,Tensor *x)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  long lVar3;
  float *pfVar4;
  MatrixUType *pMVar5;
  ulong uVar6;
  Index index;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  result_type rVar12;
  Tensor t;
  JacobiSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_2> svd;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_2d0;
  normal_distribution<float> local_2b0;
  MatrixType local_2a0;
  float *local_288;
  Index IStack_280;
  Index local_278;
  uint local_270;
  ulong local_26c;
  float *local_260;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> local_258;
  JacobiSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_2> local_240;
  
  local_258.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d0.
  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data._0_4_ = dd;
  local_2d0.
  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data._4_4_ = dd;
  local_240.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_2>_>.m_matrixV.
  super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage._4_8_ = 0x100000000;
  lVar3 = 0;
  do {
    uVar7 = local_240.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_2>_>.
            m_matrixV.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
            _4_8_ & 0xffffffff;
    local_240.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_2>_>.m_matrixV
    .super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data._4_4_ =
         local_240.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_2>_>.
         m_matrixV.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data.
         _4_4_ + 1;
    *(undefined4 *)
     ((long)&local_240.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_2>_>.
             m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
             m_data + uVar7 * 4) =
         *(undefined4 *)
          ((long)&local_2d0.
                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                  .
                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  .m_data + lVar3);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 8);
  local_278 = local_240.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_2>_>
              .m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols;
  local_270 = (uint)local_240.
                    super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_2>_>.
                    m_matrixV.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data;
  local_26c = local_240.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_2>_>
              .m_matrixV.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
              _4_8_;
  local_288 = local_240.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_2>_>
              .m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
              m_data;
  IStack_280 = local_240.
               super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_2>_>.
               m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
               m_rows;
  uVar7 = (ulong)(dd * dd) * 4;
  pfVar4 = (float *)operator_new__(uVar7);
  local_2b0._M_param._M_mean = 0.0;
  local_2b0._M_param._M_stddev = 0.01;
  local_2b0._M_saved = 0.0;
  local_2b0._M_saved_available = false;
  local_260 = pfVar4;
  if ((ulong)(dd * dd) != 0) {
    lVar3 = 0;
    do {
      rVar12 = std::normal_distribution<float>::operator()(&local_2b0,rndeng,&local_2b0._M_param);
      *(result_type *)((long)pfVar4 + lVar3) = rVar12;
      lVar3 = lVar3 + 4;
    } while (uVar7 - lVar3 != 0);
  }
  Tensor::operator*(&local_2d0,(Tensor *)&local_288);
  Eigen::PlainObjectBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
            ((PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&local_2a0,
             (DenseBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
              *)&local_2d0);
  Eigen::JacobiSVD<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD(&local_240,&local_2a0,4);
  free(local_2a0.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  pMVar5 = Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_2>_>::matrixU
                     (&local_240.
                       super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_2>_>)
  ;
  Tensor::operator*(&local_2d0,x);
  if ((local_2d0.
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_rows.m_value ==
       (pMVar5->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_rows)
     && (local_2d0.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_cols.m_value ==
         (pMVar5->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_cols)
     ) {
    uVar7 = CONCAT44(local_2d0.
                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                     .
                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                     .m_data._4_4_,
                     (uint)local_2d0.
                           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                           .
                           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                           .m_data);
    uVar6 = local_2d0.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_cols.m_value *
            local_2d0.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_rows.m_value;
    uVar8 = uVar6;
    if ((((uint)local_2d0.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data & 3) == 0) &&
       (uVar8 = (ulong)(-((uint)(uVar7 >> 2) & 0x3fffffff) & 3), (long)uVar6 <= (long)uVar8)) {
      uVar8 = uVar6;
    }
    pfVar4 = (pMVar5->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.
             m_data;
    uVar10 = uVar6 - uVar8;
    uVar9 = uVar10 + 3;
    if (-1 < (long)uVar10) {
      uVar9 = uVar10;
    }
    if (0 < (long)uVar8) {
      uVar11 = 0;
      do {
        *(float *)(uVar7 + uVar11 * 4) = pfVar4[uVar11];
        uVar11 = uVar11 + 1;
      } while (uVar8 != uVar11);
    }
    lVar3 = (uVar9 & 0xfffffffffffffffc) + uVar8;
    if (3 < (long)uVar10) {
      do {
        uVar2 = *(undefined8 *)(pfVar4 + uVar8 + 2);
        puVar1 = (undefined8 *)(uVar7 + uVar8 * 4);
        *puVar1 = *(undefined8 *)(pfVar4 + uVar8);
        puVar1[1] = uVar2;
        uVar8 = uVar8 + 4;
      } while ((long)uVar8 < lVar3);
    }
    if (lVar3 < (long)uVar6) {
      do {
        *(float *)(uVar7 + lVar3 * 4) = pfVar4[lVar3];
        lVar3 = lVar3 + 1;
      } while (uVar6 - lVar3 != 0);
    }
    if (local_260 != (float *)0x0) {
      operator_delete__(local_260);
    }
    Eigen::JacobiSVD<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(&local_240);
    std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_258);
    return;
  }
  __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                "void Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float, -1, -1>>>::resize(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, -1>>]"
               );
}

Assistant:

void OrthonormalRandom(unsigned dd, float g, Tensor& x) {
  Tensor t;
  t.d = Dim({dd, dd});
  t.v = new float[dd * dd];
  normal_distribution<float> distribution(0, 0.01);
  auto b = [&] () {return distribution(*rndeng);};
  generate(t.v, t.v + dd*dd, b);
  Eigen::JacobiSVD<Eigen::MatrixXf> svd(*t, Eigen::ComputeFullU);
  *x = svd.matrixU();
  delete[] t.v;
}